

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall
ClipperLib::Clipper::Execute
          (Clipper *this,ClipType clipType,ExPolygons *solution,PolyFillType subjFillType,
          PolyFillType clipFillType)

{
  uint uVar1;
  bool succeeded;
  PolyFillType clipFillType_local;
  PolyFillType subjFillType_local;
  ExPolygons *solution_local;
  ClipType clipType_local;
  Clipper *this_local;
  
  if ((this->m_ExecuteLocked & 1U) == 0) {
    this->m_ExecuteLocked = true;
    std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::resize(solution,0);
    this->m_SubjFillType = subjFillType;
    this->m_ClipFillType = clipFillType;
    this->m_ClipType = clipType;
    uVar1 = (*this->_vptr_Clipper[4])(this,1);
    this_local._7_1_ = (bool)((byte)uVar1 & 1);
    if ((uVar1 & 1) != 0) {
      BuildResultEx(this,solution);
    }
    this->m_ExecuteLocked = false;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::Execute(ClipType clipType, ExPolygons &solution,
    PolyFillType subjFillType, PolyFillType clipFillType)
{
  if( m_ExecuteLocked ) return false;
  m_ExecuteLocked = true;
  solution.resize(0);
  m_SubjFillType = subjFillType;
  m_ClipFillType = clipFillType;
  m_ClipType = clipType;
  bool succeeded = ExecuteInternal(true);
  if (succeeded) BuildResultEx(solution);
  m_ExecuteLocked = false;
  return succeeded;
}